

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O0

void __thiscall
pbrt::AnimatedShapeSceneEntity::AnimatedShapeSceneEntity
          (AnimatedShapeSceneEntity *this,AnimatedShapeSceneEntity *param_2)

{
  size_type sVar1;
  long in_RSI;
  TransformedSceneEntity *in_RDI;
  TransformedSceneEntity *in_stack_ffffffffffffffc8;
  
  TransformedSceneEntity::TransformedSceneEntity(in_RDI,in_stack_ffffffffffffffc8);
  sVar1 = *(size_type *)(in_RSI + 0x360);
  *(undefined8 *)&in_RDI[1].super_SceneEntity.name = *(undefined8 *)(in_RSI + 0x358);
  in_RDI[1].super_SceneEntity.name._M_string_length = sVar1;
  std::__cxx11::string::string
            ((string *)in_RDI[1].super_SceneEntity.name.field_2._M_local_buf,
             (string *)(in_RSI + 0x368));
  *(undefined4 *)&in_RDI[1].super_SceneEntity.parameters.params.field_2 =
       *(undefined4 *)(in_RSI + 0x388);
  std::__cxx11::string::string
            ((string *)((long)&in_RDI[1].super_SceneEntity.parameters.params.field_2 + 8),
             (string *)(in_RSI + 0x390));
  std::__cxx11::string::string
            ((string *)((long)&in_RDI[1].super_SceneEntity.parameters.params.field_2 + 0x28),
             (string *)(in_RSI + 0x3b0));
  return;
}

Assistant:

AnimatedShapeSceneEntity() = default;